

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

Bool GetRgb(ctmbstr color,int *rgb)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  
  lVar5 = 0;
  piVar7 = (int *)&DAT_001b281c;
  do {
    piVar6 = piVar7;
    if (lVar5 == 0x250) {
      uVar1 = prvTidytmbstrlen(color);
      if (uVar1 != 7) {
        return no;
      }
      if (*color != '#') {
        return no;
      }
      iVar2 = ctox(color[1]);
      iVar3 = ctox(color[2]);
      *rgb = iVar3 + iVar2 * 0x10;
      iVar2 = ctox(color[3]);
      iVar3 = ctox(color[4]);
      rgb[1] = iVar3 + iVar2 * 0x10;
      iVar3 = ctox(color[5]);
      iVar2 = ctox(color[6]);
      iVar2 = iVar2 + iVar3 * 0x10;
      goto LAB_0014ef62;
    }
    pcVar4 = strstr((char *)((long)&colorNames_rel + (long)*(int *)((long)&colorNames_rel + lVar5)),
                    color);
    lVar5 = lVar5 + 4;
    piVar7 = piVar6 + 3;
  } while (pcVar4 == (char *)0x0);
  *(undefined8 *)rgb = *(undefined8 *)(piVar6 + 1);
  iVar2 = *piVar7;
LAB_0014ef62:
  rgb[2] = iVar2;
  return yes;
}

Assistant:

static Bool GetRgb( ctmbstr color, int rgb[] )
{
    uint x;

    /* Check if we have a color name */
    for (x = 0; x < N_COLORS; x++)
    {
        if ( strstr(colorNames[x], color) != NULL )
        {
            rgb[0] = colorValues[x][0];
            rgb[1] = colorValues[x][1];
            rgb[2] = colorValues[x][2];
            return yes;
        }
    }

    /*
       No color name so must be hex values 
       Is this a number in hexadecimal format?
    */
    
    /* Must be 7 characters in the RGB value (including '#') */
    if ( TY_(tmbstrlen)(color) == 7 && color[0] == '#' )
    {
        rgb[0] = (ctox(color[1]) * 16) + ctox(color[2]);
        rgb[1] = (ctox(color[3]) * 16) + ctox(color[4]);
        rgb[2] = (ctox(color[5]) * 16) + ctox(color[6]);
        return yes;
    }
    return no;
}